

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O1

void __thiscall irr::gui::CGUISkin::setFont(CGUISkin *this,IGUIFont *font,EGUI_DEFAULT_FONT which)

{
  int *piVar1;
  IGUIFont *pIVar2;
  _func_int *p_Var3;
  
  if (font != (IGUIFont *)0x0 && which < EGDF_COUNT) {
    *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) =
         *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) + 1;
    pIVar2 = this->Fonts[which];
    if (pIVar2 != (IGUIFont *)0x0) {
      p_Var3 = pIVar2->_vptr_IGUIFont[-3];
      piVar1 = (int *)(&pIVar2->field_0x10 + (long)p_Var3);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar2->_vptr_IGUIFont + (long)p_Var3) + 8))();
      }
    }
    this->Fonts[which] = font;
  }
  return;
}

Assistant:

void CGUISkin::setFont(IGUIFont *font, EGUI_DEFAULT_FONT which)
{
	if ((u32)which >= EGDF_COUNT)
		return;

	if (font) {
		font->grab();
		if (Fonts[which])
			Fonts[which]->drop();

		Fonts[which] = font;
	}
}